

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persp_lh_zo.c
# Opt level: O0

void glmc_persp_sizes_lh_zo(vec4 *proj,float fovy,float *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  float farZ;
  float nearZ;
  float a;
  float t;
  float m22;
  float m32;
  
  fVar5 = tanf(in_XMM0_Da * 0.5);
  fVar1 = in_RDI[5];
  fVar2 = *in_RDI;
  fVar3 = in_RDI[0xe];
  fVar4 = in_RDI[10];
  in_RSI[1] = fVar5 * 2.0 * (fVar3 / -fVar4);
  in_RSI[3] = fVar5 * 2.0 * (fVar3 / (-fVar4 + 1.0));
  *in_RSI = (fVar1 / fVar2) * in_RSI[1];
  in_RSI[2] = (fVar1 / fVar2) * in_RSI[3];
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_persp_sizes_lh_zo(mat4 proj, float fovy, vec4 dest) {
  glm_persp_sizes_lh_zo(proj, fovy, dest);
}